

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O3

_Bool test_next_bits_iterate(void)

{
  uint64_t *puVar1;
  _Bool _Var2;
  bitset_t *pbVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  uint64_t uVar7;
  long lVar8;
  ulong uVar9;
  int i;
  ulong uVar10;
  ulong uVar11;
  size_t buffer [3];
  ulong auStack_40 [5];
  
  uVar10 = 0;
  pbVar3 = bitset_create();
  do {
    uVar11 = uVar10 >> 6;
    if (uVar11 < pbVar3->arraysize) {
LAB_00102594:
      pbVar3->array[uVar11] = pbVar3->array[uVar11] | 1L << ((byte)uVar10 & 0x3f);
    }
    else {
      _Var2 = bitset_grow(pbVar3,uVar11 + 1);
      if (_Var2) goto LAB_00102594;
    }
    uVar10 = uVar10 + 1;
  } while (uVar10 != 100);
  uVar10 = 0x3e6;
  do {
    uVar10 = uVar10 + 2;
    uVar11 = uVar10 >> 6;
    if (uVar11 < pbVar3->arraysize) {
LAB_001025d6:
      pbVar3->array[uVar11] = pbVar3->array[uVar11] | 1L << ((byte)uVar10 & 0x3e);
    }
    else {
      _Var2 = bitset_grow(pbVar3,uVar11 + 1);
      if (_Var2) goto LAB_001025d6;
    }
  } while (uVar10 < 0x44a);
  uVar10 = pbVar3->arraysize;
  if (uVar10 != 0) {
    puVar1 = pbVar3->array;
    uVar9 = 0;
    uVar11 = 0;
    lVar6 = 0;
    do {
      uVar7 = (puVar1[uVar9] >> ((byte)uVar11 & 0x3f)) << ((byte)uVar11 & 0x3f);
      uVar11 = uVar11 & 0xffffffffffffffc0;
      uVar4 = 0;
      do {
        while (uVar7 == 0) {
          uVar9 = uVar9 + 1;
          if (uVar9 == uVar10) {
            lVar8 = lVar6;
            if (uVar4 == 0) goto LAB_001026ac;
            goto LAB_0010265a;
          }
          uVar11 = uVar11 + 0x40;
          uVar7 = puVar1[uVar9];
          if (2 < uVar4) goto LAB_0010265a;
        }
        uVar5 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        auStack_40[uVar4 + 1] = uVar5 | uVar11;
        uVar4 = uVar4 + 1;
        uVar7 = uVar7 & uVar7 - 1;
      } while (uVar4 != 3);
      uVar4 = 3;
LAB_0010265a:
      lVar8 = lVar6 + uVar4;
      uVar11 = lVar6 * 2 + 800;
      uVar9 = 0;
      do {
        uVar5 = lVar6 + uVar9;
        if (99 < lVar6 + uVar9) {
          uVar5 = uVar11;
        }
        if (auStack_40[uVar9 + 1] != uVar5) {
          test_next_bits_iterate_cold_1();
          goto LAB_001026ce;
        }
        uVar9 = uVar9 + 1;
        uVar11 = uVar11 + 2;
      } while (uVar4 != uVar9);
      uVar11 = auStack_40[uVar4] + 1;
      uVar9 = uVar11 >> 6;
      lVar6 = lVar8;
    } while (uVar9 < uVar10);
LAB_001026ac:
    if (lVar8 == 0x96) {
      bitset_free(pbVar3);
      return true;
    }
  }
LAB_001026ce:
  test_next_bits_iterate_cold_2();
  uVar10 = 0;
  pbVar3 = bitset_create();
  do {
    uVar11 = uVar10 >> 6;
    if ((uVar11 < pbVar3->arraysize) || (_Var2 = bitset_grow(pbVar3,uVar11 + 1), _Var2)) {
      pbVar3->array[uVar11] = pbVar3->array[uVar11] | 1L << ((byte)uVar10 & 0x3f);
    }
    uVar10 = uVar10 + 1;
  } while (uVar10 != 100);
  uVar10 = 0x3e6;
  do {
    uVar10 = uVar10 + 2;
    uVar11 = uVar10 >> 6;
    if ((uVar11 < pbVar3->arraysize) || (_Var2 = bitset_grow(pbVar3,uVar11 + 1), _Var2)) {
      pbVar3->array[uVar11] = pbVar3->array[uVar11] | 1L << ((byte)uVar10 & 0x3e);
    }
  } while (uVar10 < 0x44a);
  uVar10 = pbVar3->arraysize;
  if (uVar10 != 0) {
    uVar4 = 0;
    uVar9 = 0;
    uVar11 = 0;
    do {
      uVar5 = pbVar3->array[uVar4] >> ((byte)uVar11 & 0x3f);
      if (uVar5 == 0) {
        lVar6 = uVar4 * -0x40;
        do {
          uVar4 = uVar4 + 1;
          if (uVar10 == uVar4) goto LAB_001027db;
          uVar11 = pbVar3->array[uVar4];
          lVar6 = lVar6 + -0x40;
        } while (uVar11 == 0);
        lVar8 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
          }
        }
        uVar11 = lVar8 - lVar6;
      }
      else {
        lVar6 = 0;
        if (uVar5 != 0) {
          for (; (uVar5 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
          }
        }
        uVar11 = uVar11 + lVar6;
      }
      uVar4 = uVar9 * 2 + 800;
      if (uVar9 < 100) {
        uVar4 = uVar9;
      }
      if (uVar11 != uVar4) {
        test_next_bit_iterate_cold_1();
        goto LAB_001027f9;
      }
      uVar9 = uVar9 + 1;
      uVar11 = uVar11 + 1;
      uVar4 = uVar11 >> 6;
    } while (uVar4 < uVar10);
LAB_001027db:
    if (uVar9 == 0x96) {
      bitset_free(pbVar3);
      return true;
    }
  }
LAB_001027f9:
  test_next_bit_iterate_cold_2();
  test_next_bit_iterate();
  test_next_bits_iterate();
  test_set_to_val();
  test_construct();
  test_union_intersection();
  test_iterate();
  test_iterate2();
  test_max_min();
  test_counts();
  test_shift_right();
  test_shift_left();
  test_disjoint();
  test_intersects();
  test_contains_all();
  test_contains_all_different_sizes();
  puts("All TEST_ASSERTs passed. Code is probably ok.");
  return false;
}

Assistant:

bool test_next_bits_iterate() {
  bitset_t *b = bitset_create();
  for (int i = 0; i < 100; i++)
    bitset_set(b, i);
  for (int i = 1000; i < 1100; i += 2)
    bitset_set(b, i);

  size_t buffer[3];
  size_t howmany = 0;
  size_t i = 0;
  for (size_t startfrom = 0;
       (howmany = bitset_next_set_bits(
            b, buffer, sizeof(buffer) / sizeof(buffer[0]), &startfrom)) > 0;
       startfrom++) {
    for (size_t j = 0; j < howmany; j++) {
      size_t expected;
      if (i < 100) {
        expected = i;
      } else {
        expected = 1000 + 2 * (i - 100);
      }
      TEST_ASSERT(buffer[j] == expected);
      ++i;
    }
  }
  TEST_ASSERT(i == 150);
  bitset_free(b);
  return true;
}